

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::tcp::TcpComms,_helics::CoreBroker>::~CommsBroker
          (CommsBroker<helics::tcp::TcpComms,_helics::CoreBroker> *this)

{
  memory_order mVar1;
  memory_order *pmVar2;
  undefined8 *in_RDI;
  int exp;
  undefined4 in_stack_fffffffffffffee8;
  memory_order in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  memory_order in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff30;
  memory_order in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  duration<long,std::ratio<1l,1000l>> local_58 [12];
  memory_order local_4c [3];
  undefined4 local_40;
  undefined4 local_3c;
  memory_order *local_38;
  memory_order *local_30;
  bool local_21;
  undefined4 local_20;
  memory_order local_1c;
  undefined4 local_18;
  undefined4 local_14;
  memory_order *local_10;
  memory_order *local_8;
  
  *in_RDI = &PTR__CommsBroker_009d0b10;
  in_RDI[1] = &PTR__CommsBroker_009d0c68;
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             SUB41(in_stack_fffffffffffffeec >> 0x18,0));
  local_4c[0] = acquire;
  while( true ) {
    pmVar2 = (memory_order *)(in_RDI + 0x1ce);
    local_3c = 3;
    local_40 = 5;
    local_38 = local_4c;
    local_30 = pmVar2;
    local_1c = std::__cmpexch_failure_order(in_stack_fffffffffffffef4);
    local_14 = 3;
    local_18 = 5;
    local_20 = 3;
    switch(0x4efa78) {
    default:
      if (local_1c - consume < 2) {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      else if (local_1c == seq_cst) {
        LOCK();
        in_stack_ffffffffffffff34 = *pmVar2;
        local_21 = local_4c[0] == in_stack_ffffffffffffff34;
        if (local_21) {
          *pmVar2 = release;
          in_stack_ffffffffffffff34 = local_4c[0];
        }
        UNLOCK();
        in_stack_ffffffffffffff30 = CONCAT13(local_21,(int3)in_stack_ffffffffffffff30);
        if (!local_21) {
          local_4c[0] = in_stack_ffffffffffffff34;
        }
      }
      else {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      break;
    case 2:
      if (local_1c - consume < 2) {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      else if (local_1c == seq_cst) {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      else {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      break;
    case 3:
      if (local_1c - consume < 2) {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      else if (local_1c == seq_cst) {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      else {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
      break;
    case 4:
      if (local_1c - consume < 2) {
        LOCK();
        in_stack_fffffffffffffef4 = *pmVar2;
        local_21 = local_4c[0] == in_stack_fffffffffffffef4;
        if (local_21) {
          *pmVar2 = release;
          in_stack_fffffffffffffef4 = local_4c[0];
        }
        UNLOCK();
        in_stack_fffffffffffffef0 = CONCAT13(local_21,(int3)in_stack_fffffffffffffef0);
        if (!local_21) {
          local_4c[0] = in_stack_fffffffffffffef4;
        }
      }
      else if (local_1c == seq_cst) {
        LOCK();
        in_stack_fffffffffffffeec = *pmVar2;
        local_21 = local_4c[0] == in_stack_fffffffffffffeec;
        if (local_21) {
          *pmVar2 = release;
          in_stack_fffffffffffffeec = local_4c[0];
        }
        UNLOCK();
        in_stack_fffffffffffffee8 = CONCAT13(local_21,(int3)in_stack_fffffffffffffee8);
        if (!local_21) {
          local_4c[0] = in_stack_fffffffffffffeec;
        }
      }
      else {
        LOCK();
        mVar1 = *pmVar2;
        local_21 = local_4c[0] == mVar1;
        if (local_21) {
          *pmVar2 = release;
          mVar1 = local_4c[0];
        }
        UNLOCK();
        if (!local_21) {
          local_4c[0] = mVar1;
        }
      }
    }
    local_10 = local_4c;
    local_8 = pmVar2;
    if (((local_21 ^ 0xffU) & 1) == 0) break;
    if (local_4c[0] == relaxed) {
      commDisconnect((CommsBroker<helics::tcp::TcpComms,_helics::CoreBroker> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      local_4c[0] = consume;
    }
    else {
      in_stack_ffffffffffffffa4 = 0x32;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                (local_58,(int *)&stack0xffffffffffffffa4);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
  }
  std::unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>::operator=
            ((unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (nullptr_t)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  BrokerBase::joinAllThreads
            ((BrokerBase *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>::~unique_ptr
            ((unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  CoreBroker::~CoreBroker
            ((CoreBroker *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::~CommsBroker()
{
    BrokerBase::haltOperations = true;
    int exp = 2;
    while (!disconnectionStage.compare_exchange_weak(exp, 3)) {
        if (exp == 0) {
            commDisconnect();
            exp = 1;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
    comms = nullptr;  // need to ensure the comms are deleted before the callbacks become invalid
    BrokerBase::joinAllThreads();
}